

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * duckdb::FileSystem::ExpandPath
                   (string *__return_storage_ptr__,string *path,
                   optional_ptr<duckdb::FileOpener,_true> opener)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((path->_M_string_length == 0) || (*(path->_M_dataplus)._M_p != '~')) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  else {
    GetHomeDirectory_abi_cxx11_
              (&local_30,(FileSystem *)opener.ptr,(optional_ptr<duckdb::FileOpener,_true>)opener.ptr
              );
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
    ::std::operator+(__return_storage_ptr__,&local_30,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::ExpandPath(const string &path, optional_ptr<FileOpener> opener) {
	if (path.empty()) {
		return path;
	}
	if (path[0] == '~') {
		return GetHomeDirectory(opener) + path.substr(1);
	}
	return path;
}